

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase1395::run(TestCase1395 *this)

{
  SourceLocation location;
  SourceLocation location_00;
  SourceLocation location_01;
  bool bVar1;
  DebugExpression<bool> _kjCondition;
  Fault f;
  PromiseFulfillerPair<void> paf;
  WaitScope waitScope;
  EventLoop loop;
  DebugExpression<bool> local_109;
  Fault local_108;
  char *pcStack_100;
  undefined8 local_f8;
  OwnPromiseNode local_f0 [2];
  PromiseFulfiller<void> *in_stack_ffffffffffffff20;
  EventLoop *this_00;
  uint uVar2;
  uint in_stack_ffffffffffffff34;
  EventLoop local_88;
  
  this_00 = &local_88;
  EventLoop::EventLoop(this_00);
  uVar2 = 0xffffffff;
  EventLoop::enterScope(this_00);
  location_01.function = (char *)this_00;
  location_01.fileName = (char *)in_stack_ffffffffffffff20;
  location_01.lineNumber = uVar2;
  location_01.columnNumber = in_stack_ffffffffffffff34;
  newPromiseAndFulfiller<void>(location_01);
  local_108.exception = (Exception *)0x3d3020;
  pcStack_100 = "run";
  local_f8 = 0x2900000578;
  location.function = "run";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location.lineNumber = 0x578;
  location.columnNumber = 0x29;
  bVar1 = kj::_::pollImpl(local_f0[0].ptr,(WaitScope *)&stack0xffffffffffffff28,location);
  local_109.value = !bVar1;
  if (bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              (&local_108,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x578,FAILED,"!paf.promise.poll(waitScope)","_kjCondition,",&local_109);
    kj::_::Debug::Fault::fatal(&local_108);
  }
  (*(in_stack_ffffffffffffff20->super_PromiseRejector)._vptr_PromiseRejector[2])
            (in_stack_ffffffffffffff20,&local_108);
  local_108.exception = (Exception *)0x3d3020;
  pcStack_100 = "run";
  local_f8 = 0x280000057a;
  location_00.function = "run";
  location_00.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location_00.lineNumber = 0x57a;
  location_00.columnNumber = 0x28;
  local_109.value =
       kj::_::pollImpl(local_f0[0].ptr,(WaitScope *)&stack0xffffffffffffff28,location_00);
  if (local_109.value) {
    Promise<void>::wait((Promise<void> *)local_f0,&stack0xffffffffffffff28);
    PromiseFulfillerPair<void>::~PromiseFulfillerPair((PromiseFulfillerPair<void> *)local_f0);
    WaitScope::~WaitScope((WaitScope *)&stack0xffffffffffffff28);
    EventLoop::~EventLoop(&local_88);
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
            (&local_108,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,0x57a,FAILED,"paf.promise.poll(waitScope)","_kjCondition,",&local_109);
  kj::_::Debug::Fault::fatal(&local_108);
}

Assistant:

TEST(Async, Poll) {
  EventLoop loop;
  WaitScope waitScope(loop);

  auto paf = newPromiseAndFulfiller<void>();
  KJ_ASSERT(!paf.promise.poll(waitScope));
  paf.fulfiller->fulfill();
  KJ_ASSERT(paf.promise.poll(waitScope));
  paf.promise.wait(waitScope);
}